

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_bitfield_insert_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,uint32_t op3,char *op,BaseType offset_count_type)

{
  bool bVar1;
  SPIRType *pSVar2;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  char (*in_stack_fffffffffffffd20) [2];
  bool local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  undefined1 local_208 [8];
  SPIRType target_type;
  string op3_expr;
  string op2_expr;
  undefined1 local_68 [8];
  string op1_expr;
  string op0_expr;
  bool forward;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,op2);
  bVar1 = should_forward(this,op0);
  local_2a9 = false;
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    local_2a9 = false;
    if (bVar1) {
      bVar1 = should_forward(this,op2);
      local_2a9 = false;
      if (bVar1) {
        local_2a9 = should_forward(this,op3);
      }
    }
  }
  to_unpacked_expression_abi_cxx11_((string *)((long)&op1_expr.field_2 + 8),this,op0,true);
  to_unpacked_expression_abi_cxx11_((string *)local_68,this,op1,true);
  to_unpacked_expression_abi_cxx11_((string *)((long)&op3_expr.field_2 + 8),this,op2,true);
  to_unpacked_expression_abi_cxx11_
            ((string *)&target_type.member_name_cache._M_h._M_single_bucket,this,op3,true);
  if (offset_count_type != UInt && offset_count_type != Int) {
    __assert_fail("offset_count_type == SPIRType::UInt || offset_count_type == SPIRType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                  ,0x1c40,
                  "void spirv_cross::CompilerGLSL::emit_bitfield_insert_op(uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, uint32_t, const char *, SPIRType::BaseType)"
                 );
  }
  SPIRType::SPIRType((SPIRType *)local_208,OpTypeInt);
  target_type.super_IVariant._12_4_ = 0x20;
  target_type.basetype = Void;
  target_type.super_IVariant.self.id = offset_count_type;
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op2);
  if (pSVar2->basetype != offset_count_type) {
    type_to_glsl_constructor_abi_cxx11_(&local_248,this,(SPIRType *)local_208);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_228,(spirv_cross *)&local_248,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
               (char (*) [2])((long)&op3_expr.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,ts_3);
    ::std::__cxx11::string::operator=
              ((string *)(op3_expr.field_2._M_local_buf + 8),(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_248);
  }
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op3);
  if (pSVar2->basetype != offset_count_type) {
    type_to_glsl_constructor_abi_cxx11_(&local_288,this,(SPIRType *)local_208);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_268,(spirv_cross *)&local_288,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a488c,
               (char (*) [2])&target_type.member_name_cache._M_h._M_single_bucket,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,ts_3);
    ::std::__cxx11::string::operator=
              ((string *)&target_type.member_name_cache._M_h._M_single_bucket,(string *)&local_268);
    ::std::__cxx11::string::~string((string *)&local_268);
    ::std::__cxx11::string::~string((string *)&local_288);
  }
  join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
            (&local_2a8,(spirv_cross *)&op,(char **)0x4a488c,
             (char (*) [2])((long)&op1_expr.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
             (char (*) [3])local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
             (char (*) [3])((long)&op3_expr.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
             (char (*) [3])&target_type.member_name_cache._M_h._M_single_bucket,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
             in_stack_fffffffffffffd20);
  emit_op(this,result_type,result_id,&local_2a8,local_2a9,false);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op3);
  SPIRType::~SPIRType((SPIRType *)local_208);
  ::std::__cxx11::string::~string((string *)&target_type.member_name_cache._M_h._M_single_bucket);
  ::std::__cxx11::string::~string((string *)(op3_expr.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)local_68);
  ::std::__cxx11::string::~string((string *)(op1_expr.field_2._M_local_buf + 8));
  return;
}

Assistant:

void CompilerGLSL::emit_bitfield_insert_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                           uint32_t op2, uint32_t op3, const char *op,
                                           SPIRType::BaseType offset_count_type)
{
	// Only need to cast offset/count arguments. Types of base/insert must be same as result type,
	// and bitfieldInsert is sign invariant.
	bool forward = should_forward(op0) && should_forward(op1) && should_forward(op2) && should_forward(op3);

	auto op0_expr = to_unpacked_expression(op0);
	auto op1_expr = to_unpacked_expression(op1);
	auto op2_expr = to_unpacked_expression(op2);
	auto op3_expr = to_unpacked_expression(op3);

	assert(offset_count_type == SPIRType::UInt || offset_count_type == SPIRType::Int);
	SPIRType target_type { OpTypeInt };
	target_type.width = 32;
	target_type.vecsize = 1;
	target_type.basetype = offset_count_type;

	if (expression_type(op2).basetype != offset_count_type)
	{
		// Value-cast here. Input might be 16-bit. GLSL requires int.
		op2_expr = join(type_to_glsl_constructor(target_type), "(", op2_expr, ")");
	}

	if (expression_type(op3).basetype != offset_count_type)
	{
		// Value-cast here. Input might be 16-bit. GLSL requires int.
		op3_expr = join(type_to_glsl_constructor(target_type), "(", op3_expr, ")");
	}

	emit_op(result_type, result_id, join(op, "(", op0_expr, ", ", op1_expr, ", ", op2_expr, ", ", op3_expr, ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
	inherit_expression_dependencies(result_id, op3);
}